

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 15-extract-function.cpp
# Opt level: O3

void fun(env *lest_env,int a,int b)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *os;
  failure *this;
  result score;
  int local_270;
  int local_26c;
  result local_268;
  undefined1 *local_220;
  long local_218;
  undefined1 local_210 [16];
  undefined1 *local_200;
  long local_1f8;
  undefined1 local_1f0 [48];
  text local_1c0;
  text local_1a0;
  text local_180 [2];
  location local_138;
  text local_110;
  text local_f0;
  location local_d0;
  message local_a8;
  
  local_a8._0_8_ = &local_26c;
  local_270 = b;
  local_26c = a;
  lest::expression_lhs<int_const&>::operator==
            (&local_268,(expression_lhs<int_const&> *)&local_a8,&local_270);
  if (local_268.passed != false) {
    if ((lest_env->opt).pass == true) {
      os = lest_env->os;
      local_220 = local_210;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_220,
                 "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]lest/example/15-extract-function.cpp"
                 ,"");
      paVar1 = &local_138.file.field_2;
      local_138.file._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,local_220,local_220 + local_218);
      local_138.line = 0xb;
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"a == b","");
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c0,local_268.decomposition._M_dataplus._M_p,
                 local_268.decomposition._M_dataplus._M_p + local_268.decomposition._M_string_length
                );
      lest::passing::passing
                ((passing *)&local_a8,&local_138,&local_1a0,&local_1c0,(lest_env->opt).zen);
      lest::env::context_abi_cxx11_(&local_110,lest_env);
      lest::report(os,&local_a8,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      lest::message::~message(&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138.file._M_dataplus._M_p != paVar1) {
        operator_delete(local_138.file._M_dataplus._M_p);
      }
      if (local_220 != local_210) {
        operator_delete(local_220);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268.decomposition._M_dataplus._M_p != &local_268.decomposition.field_2) {
      operator_delete(local_268.decomposition._M_dataplus._M_p);
    }
    return;
  }
  this = (failure *)__cxa_allocate_exception(0x78);
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]lest/example/15-extract-function.cpp"
             ,"");
  local_d0.file._M_dataplus._M_p = (pointer)&local_d0.file.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_200,local_200 + local_1f8);
  local_d0.line = 0xb;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"a == b","");
  local_180[0]._M_dataplus._M_p = (pointer)&local_180[0].field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_180,local_268.decomposition._M_dataplus._M_p,
             local_268.decomposition._M_dataplus._M_p + local_268.decomposition._M_string_length);
  lest::failure::failure(this,&local_d0,&local_f0,local_180);
  __cxa_throw(this,&lest::failure::typeinfo,lest::message::~message);
}

Assistant:

void fun( lest::env & lest_env, int a, int b )
{
    EXPECT( a == b );
}